

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  int iVar1;
  Expr *pExpr_00;
  ExprList *pEVar2;
  long lVar3;
  anon_union_4_2_6146edf4_for_u *paVar4;
  int iVar5;
  
  pEVar2 = pParse->pConstExpr;
  if (pEVar2 != (ExprList *)0x0 && regDest < 0) {
    paVar4 = &pEVar2->a[0].u;
    for (iVar5 = pEVar2->nExpr; 0 < iVar5; iVar5 = iVar5 + -1) {
      if (((paVar4->iConstExprReg & 0x40000000000U) != 0) &&
         (iVar1 = sqlite3ExprCompare((Parse *)0x0,((ExprList_item *)(paVar4 + -7))->pExpr,pExpr,-1),
         iVar1 == 0)) {
        return paVar4->iConstExprReg;
      }
      paVar4 = paVar4 + 8;
    }
  }
  pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
  pEVar2 = sqlite3ExprListAppend(pParse,pEVar2,pExpr_00);
  if (pEVar2 != (ExprList *)0x0) {
    lVar3 = (long)pEVar2->nExpr;
    pEVar2->a[lVar3 + -1].field_0x19 =
         pEVar2->a[lVar3 + -1].field_0x19 & 0xfb | (byte)((uint)regDest >> 0x1d) & 4;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar2->a[lVar3 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar2;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}